

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O2

QString * __thiscall
QMakeGlobals::cleanSpec
          (QString *__return_storage_ptr__,QMakeGlobals *this,QMakeCmdLineParserState *state,
          QString *spec)

{
  bool bVar1;
  char cVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QDir::cleanPath((QString *)__return_storage_ptr__);
  bVar1 = QString::contains(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
  if (bVar1) {
    local_48.size = -0x5555555555555556;
    local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QMakeInternal::IoUtils::resolvePath((QString *)&local_48,&state->pwd,__return_storage_ptr__);
    cVar2 = QFile::exists((QString *)&local_48);
    if (cVar2 != '\0') {
      QString::operator=(__return_storage_ptr__,(QString *)&local_48);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeGlobals::cleanSpec(QMakeCmdLineParserState &state, const QString &spec)
{
    QString ret = QDir::cleanPath(spec);
    if (ret.contains(QLatin1Char('/'))) {
        QString absRet = IoUtils::resolvePath(state.pwd, ret);
        if (QFile::exists(absRet))
            ret = absRet;
    }
    return ret;
}